

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivially_serializable.cpp
# Opt level: O1

void __thiscall handlegraph::TriviallySerializable::close_fd(TriviallySerializable *this,int fd)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  runtime_error *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = close(fd);
  if (iVar1 == 0) {
    return;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Could not close FD: ",0x14);
  pcVar3 = strerror(iVar1);
  std::operator<<(local_190,pcVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TriviallySerializable::close_fd(int fd) const {
    // Close up the file
    if (::close(fd) != 0) {
        // An error happened closing
        auto problem = errno;
        std::stringstream ss;
        ss << "Could not close FD: " << ::strerror(problem);
        throw std::runtime_error(ss.str());
    }
}